

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy.c
# Opt level: O1

void proxy_activate(ProxySocket *ps)

{
  bufchain *ch;
  bufchain *ch_00;
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  ulong uVar4;
  ptrlen pVar5;
  
  proxy_negotiator_cleanup(ps);
  uVar4 = 0;
  (*ps->plug->vt->log)(ps->plug,PLUGLOG_CONNECT_SUCCESS,(SockAddr *)0x0,0,(char *)0x0,0);
  (*ps->sub_socket->vt->set_frozen)(ps->sub_socket,true);
  ch = &ps->pending_oob_output_data;
  sVar1 = bufchain_size(ch);
  ch_00 = &ps->pending_output_data;
  sVar2 = bufchain_size(ch_00);
  sVar3 = bufchain_size(ch);
  if (sVar3 != 0) {
    uVar4 = 0;
    do {
      pVar5 = bufchain_prefix(ch);
      sVar3 = (*ps->sub_socket->vt->write_oob)(ps->sub_socket,pVar5.ptr,pVar5.len);
      uVar4 = uVar4 + sVar3;
      bufchain_consume(ch,pVar5.len);
      sVar3 = bufchain_size(ch);
    } while (sVar3 != 0);
  }
  while( true ) {
    sVar3 = bufchain_size(ch_00);
    if (sVar3 == 0) break;
    pVar5 = bufchain_prefix(ch_00);
    sVar3 = (*ps->sub_socket->vt->write)(ps->sub_socket,pVar5.ptr,pVar5.len);
    uVar4 = uVar4 + sVar3;
    bufchain_consume(ch_00,pVar5.len);
  }
  if (uVar4 < sVar2 + sVar1) {
    (*ps->plug->vt->sent)(ps->plug,uVar4);
  }
  if (ps->pending_eof == true) {
    (*ps->sub_socket->vt->write_eof)(ps->sub_socket);
  }
  if (ps->freeze != false) {
    return;
  }
  (*((ps->sock).vt)->set_frozen)(&ps->sock,false);
  return;
}

Assistant:

void proxy_activate(ProxySocket *ps)
{
    size_t output_before, output_after;

    proxy_negotiator_cleanup(ps);

    plug_log(ps->plug, PLUGLOG_CONNECT_SUCCESS, NULL, 0, NULL, 0);

    /* we want to ignore new receive events until we have sent
     * all of our buffered receive data.
     */
    sk_set_frozen(ps->sub_socket, true);

    /* how many bytes of output have we buffered? */
    output_before = bufchain_size(&ps->pending_oob_output_data) +
        bufchain_size(&ps->pending_output_data);
    /* and keep track of how many bytes do not get sent. */
    output_after = 0;

    /* send buffered OOB writes */
    while (bufchain_size(&ps->pending_oob_output_data) > 0) {
        ptrlen data = bufchain_prefix(&ps->pending_oob_output_data);
        output_after += sk_write_oob(ps->sub_socket, data.ptr, data.len);
        bufchain_consume(&ps->pending_oob_output_data, data.len);
    }

    /* send buffered normal writes */
    while (bufchain_size(&ps->pending_output_data) > 0) {
        ptrlen data = bufchain_prefix(&ps->pending_output_data);
        output_after += sk_write(ps->sub_socket, data.ptr, data.len);
        bufchain_consume(&ps->pending_output_data, data.len);
    }

    /* if we managed to send any data, let the higher levels know. */
    if (output_after < output_before)
        plug_sent(ps->plug, output_after);

    /* if we have a pending EOF to send, send it */
    if (ps->pending_eof) sk_write_eof(ps->sub_socket);

    /* if the backend wanted the socket unfrozen, try to unfreeze.
     * our set_frozen handler will flush buffered receive data before
     * unfreezing the actual underlying socket.
     */
    if (!ps->freeze)
        sk_set_frozen(&ps->sock, false);
}